

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O0

void basic_suite::test_null(void)

{
  string local_1f8 [36];
  undefined4 local_1d4;
  size_type local_1d0 [3];
  undefined1 local_1b8 [8];
  writer writer;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_writer<char,16ul>::basic_writer<std::__cxx11::ostringstream>
            ((basic_writer<char,16ul> *)local_1b8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_1d0[0] = trial::protocol::json::basic_writer<char,_16UL>::
                 value<trial::protocol::json::token::null>((basic_writer<char,_16UL> *)local_1b8);
  local_1d4 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value<token::null>()","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x25,"void basic_suite::test_null()",local_1d0,&local_1d4);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[5]>
            ("result.str()","\"null\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x26,"void basic_suite::test_null()",local_1f8,"null");
  std::__cxx11::string::~string(local_1f8);
  trial::protocol::json::basic_writer<char,_16UL>::~basic_writer
            ((basic_writer<char,_16UL> *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_null()
{
    std::ostringstream result;
    json::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value<token::null>(), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "null");
}